

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::Binary::finalize(Binary *this)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  uint uVar3;
  
  if ((this->left != (Expression *)0x0) && (this->right != (Expression *)0x0)) {
    uVar1 = (this->left->type).id;
    uVar2 = 1;
    if ((uVar1 != 1) &&
       ((((this->right->type).id != 1 && (uVar3 = this->op - EqInt32, uVar2 = uVar1, uVar3 < 0x3d))
        && ((0x1f80fc07fe0003ffU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
      uVar2 = 2;
    }
    (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = uVar2;
    return;
  }
  __assert_fail("left && right",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x2fd,"void wasm::Binary::finalize()");
}

Assistant:

void Binary::finalize() {
  assert(left && right);
  if (left->type == Type::unreachable || right->type == Type::unreachable) {
    type = Type::unreachable;
  } else if (isRelational()) {
    type = Type::i32;
  } else {
    type = left->type;
  }
}